

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uart.c
# Opt level: O1

int mraa_uart_write(mraa_uart_context dev,char *buf,size_t len)

{
  _func_int_mraa_uart_context_char_ptr_size_t *UNRECOVERED_JUMPTABLE;
  int iVar1;
  ssize_t sVar2;
  
  if (dev == (mraa_uart_context)0x0) {
    syslog(3,"uart: write: context is NULL");
    iVar1 = 5;
  }
  else {
    if ((dev->advance_func != (mraa_adv_func_t *)0x0) &&
       (UNRECOVERED_JUMPTABLE = dev->advance_func->uart_write_replace,
       UNRECOVERED_JUMPTABLE != (_func_int_mraa_uart_context_char_ptr_size_t *)0x0)) {
      iVar1 = (*UNRECOVERED_JUMPTABLE)(dev,buf,len);
      return iVar1;
    }
    if (dev->fd < 0) {
      syslog(3,"uart%i: write: port is not open",(ulong)(uint)dev->index);
      iVar1 = 7;
    }
    else {
      sVar2 = write(dev->fd,buf,len);
      iVar1 = (int)sVar2;
    }
  }
  return iVar1;
}

Assistant:

int
mraa_uart_write(mraa_uart_context dev, const char* buf, size_t len)
{
    if (!dev) {
        syslog(LOG_ERR, "uart: write: context is NULL");
        return MRAA_ERROR_INVALID_HANDLE;
    }

    if (IS_FUNC_DEFINED(dev, uart_write_replace)) {
        return dev->advance_func->uart_write_replace(dev, buf, len);
    }

    if (dev->fd < 0) {
        syslog(LOG_ERR, "uart%i: write: port is not open", dev->index);
        return MRAA_ERROR_INVALID_RESOURCE;
    }

    return write(dev->fd, buf, len);
}